

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

string * __thiscall
soul::heart::Printer::PrinterStream::getTypeDescription_abi_cxx11_
          (string *__return_storage_ptr__,PrinterStream *this,Type *type)

{
  Module *o;
  Type local_40;
  pool_ptr<const_soul::Module> local_28;
  Type *local_20;
  Type *type_local;
  PrinterStream *this_local;
  
  o = this->module;
  local_20 = type;
  type_local = (Type *)this;
  this_local = (PrinterStream *)__return_storage_ptr__;
  pool_ptr<soul::Module_const>::pool_ptr<soul::Module_const,void>
            ((pool_ptr<soul::Module_const> *)&local_28,o);
  Type::removeConstIfPresent(&local_40,local_20);
  Program::getTypeDescriptionWithQualificationIfNeeded_abi_cxx11_
            (__return_storage_ptr__,&o->program,&local_28,&local_40);
  Type::~Type(&local_40);
  pool_ptr<const_soul::Module>::~pool_ptr(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string getTypeDescription (const Type& type) const
        {
            return module.program.getTypeDescriptionWithQualificationIfNeeded (module, type.removeConstIfPresent());
        }